

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmbignumlib.cpp
# Opt level: O1

void CVmObjBigNum::parse_str_into(char *ext,char *str,size_t len,int radix)

{
  CVmBigNumCacheReg *pCVar1;
  bool bVar2;
  CVmBigNumCache *pCVar3;
  uint16_t tmp;
  wchar_t wVar4;
  wchar_t wVar5;
  int iVar6;
  ulong uVar7;
  uint uVar8;
  ulong __n;
  char *pcVar9;
  byte *pbVar10;
  char *pcVar11;
  bool bVar12;
  bool bVar13;
  char dreg [7];
  uint thdl;
  char *local_60;
  undefined4 local_58;
  undefined3 uStack_54;
  char *local_50;
  ulong local_48;
  uint local_3c;
  ulong local_38;
  
  if (radix == 0) {
    radix = radix_from_string(str,len);
    bVar12 = radix == 0x10;
  }
  else {
    bVar12 = false;
  }
  if (radix == 10) {
    parse_str_into(ext,str,len);
    return;
  }
  local_48 = (ulong)*(ushort *)ext;
  ext[4] = ext[4] & 0xf9;
  __n = (ulong)(*(ushort *)ext + 1 >> 1);
  local_50 = ext;
  memset(ext + 5,0,__n);
  bVar13 = len == 0;
  if (bVar13) {
    bVar13 = false;
  }
  else {
    wVar4 = utf8_ptr::s_getch(str);
    pbVar10 = (byte *)str;
    while (((uint)wVar4 < 0x80 && (iVar6 = isspace(wVar4), iVar6 != 0))) {
      str = (char *)(pbVar10 +
                    (ulong)(((*pbVar10 >> 5 & 1) != 0) + 1 & (uint)(*pbVar10 >> 7) * 3) + 1);
      len = (size_t)(pbVar10 + (len - (long)str));
      bVar13 = (byte *)len == (byte *)0x0;
      if (bVar13) goto LAB_0023b5d3;
      wVar4 = utf8_ptr::s_getch(str);
      pbVar10 = (byte *)str;
    }
    str = (char *)pbVar10;
    if ((bVar13) ||
       ((wVar4 = utf8_ptr::s_getch((char *)pbVar10), wVar4 != L'+' &&
        (wVar5 = utf8_ptr::s_getch((char *)pbVar10), wVar5 != L'-')))) {
LAB_0023b5d3:
      bVar13 = false;
    }
    else {
      bVar13 = wVar4 != L'+';
      str = (char *)(pbVar10 +
                    (ulong)(((*pbVar10 >> 5 & 1) != 0) + 1 & (uint)(*pbVar10 >> 7) * 3) + 1);
      len = (size_t)(pbVar10 + (len - (long)str));
    }
  }
  while ((((byte *)len != (byte *)0x0 && (wVar4 = utf8_ptr::s_getch(str), (uint)wVar4 < 0x80)) &&
         (iVar6 = isspace(wVar4), iVar6 != 0))) {
    len = (size_t)((byte *)str +
                  (len - (long)((byte *)str +
                               (ulong)((((byte)*str >> 5 & 1) != 0) + 1 &
                                      (uint)((byte)*str >> 7) * 3) + 1)));
    str = (char *)((byte *)str +
                  (ulong)((((byte)*str >> 5 & 1) != 0) + 1 & (uint)((byte)*str >> 7) * 3) + 1);
  }
  pbVar10 = (byte *)str;
  if (((bVar12 && (byte *)len != (byte *)0x0) && (wVar4 = utf8_ptr::s_getch(str), wVar4 == L'0')) &&
     ((wVar4 = utf8_ptr::s_getch_at(str,1), wVar4 == L'x' ||
      (wVar4 = utf8_ptr::s_getch_at(str,1), wVar4 == L'X')))) {
    uVar7 = (ulong)((((byte)*str >> 5 & 1) != 0) + 1 & (uint)((byte)*str >> 7) * 3);
    pbVar10 = (byte *)str +
              (((((byte *)str)[uVar7 + 1] >> 5 & 1) != 0) + 1 &
              (uint)(((byte *)str)[uVar7 + 1] >> 7) * 3) + uVar7 + 2;
    len = (size_t)((byte *)str + (len - (long)pbVar10));
  }
  local_60 = CVmBigNumCache::alloc_reg(S_bignum_cache,__n + 5,&local_3c);
  if (local_60 != (char *)0x0) {
    *(short *)local_60 = (short)local_48;
    local_60[4] = '\0';
  }
  pcVar9 = local_50;
  if ((byte *)len != (byte *)0x0) {
    local_38 = (ulong)(uint)radix;
    bVar12 = false;
    local_48 = CONCAT44(local_48._4_4_,radix);
    pcVar11 = local_50;
    do {
      wVar4 = utf8_ptr::s_getch((char *)pbVar10);
      uVar8 = wVar4 + L'\xffffffd0';
      pcVar9 = pcVar11;
      if (uVar8 < 10) {
LAB_0023b7e0:
        if (radix <= (int)uVar8) goto LAB_0023b844;
        if (wVar4 != L'0') {
          bVar12 = true;
        }
        bVar2 = true;
        if (bVar12) {
          uStack_54 = 0;
          local_58 = 2;
          set_uint_val((char *)&local_58,(ulong)uVar8);
          mul_by_long(pcVar11,local_38);
          compute_abs_sum_into(local_60,pcVar11,(char *)&local_58);
          pcVar9 = local_60;
          local_60 = pcVar11;
        }
      }
      else {
        if ((uint)(wVar4 + L'\xffffffbf') < 0x1a) {
          uVar8 = wVar4 + L'\xffffffc9';
          goto LAB_0023b7e0;
        }
        if ((uint)(wVar4 + L'\xffffff9f') < 0x1a) {
          uVar8 = wVar4 + L'\xffffffa9';
          goto LAB_0023b7e0;
        }
LAB_0023b844:
        bVar2 = false;
      }
      if (!bVar2) break;
      len = (size_t)(pbVar10 +
                    (len - (long)(pbVar10 +
                                 (ulong)(((*pbVar10 >> 5 & 1) != 0) + 1 & (uint)(*pbVar10 >> 7) * 3)
                                 + 1)));
      pbVar10 = pbVar10 + (ulong)(((*pbVar10 >> 5 & 1) != 0) + 1 & (uint)(*pbVar10 >> 7) * 3) + 1;
      pcVar11 = pcVar9;
      radix = (uint)local_48;
    } while ((byte *)len != (byte *)0x0);
  }
  pcVar11 = local_50;
  if (pcVar9 != local_50) {
    copy_val(local_50,pcVar9,0);
  }
  pCVar3 = S_bignum_cache;
  pCVar1 = S_bignum_cache->reg_;
  pCVar1[local_3c].nxt_ = S_bignum_cache->free_reg_;
  pCVar3->free_reg_ = pCVar1 + local_3c;
  pcVar11[4] = (pcVar11[4] & 0xfeU) + bVar13;
  return;
}

Assistant:

void CVmObjBigNum::parse_str_into(char *ext, const char *str, size_t len,
                                  int radix)
{
    /* if the radix is 0, infer the radix from the string */
    int inferred_radix = 0;
    if (radix == 0)
        radix = inferred_radix = radix_from_string(str, len);
    
    /* if it's decimal, parse as a floating point value */
    if (radix == 10)
    {
        parse_str_into(ext, str, len);
        return;
    }

    /* get the precision */
    size_t prec = get_prec(ext);

    /* set the initial value to zero */
    set_type(ext, VMBN_T_NUM);
    memset(ext + VMBN_MANT, 0, (prec + 1)/2);

    /* set up to scan the string */
    utf8_ptr p((char *)str);
    size_t rem = len;

    /* skip leading spaces */
    for ( ; rem != 0 && is_space(p.getch()) ; p.inc(&rem)) ;

    /* check for a sign */
    int neg = FALSE;
    if (rem != 0 && p.getch() == '+')
    {
        /* skip the sign */
        p.inc(&rem);
    }
    else if (rem != 0 && p.getch() == '-')
    {
        /* note the sign and skip it */
        neg = TRUE;
        p.inc(&rem);
    }

    /* skip spaces after the sign */
    for ( ; rem != 0 && is_space(p.getch()) ; p.inc(&rem)) ;

    /* if we inferred the radix as hax, skip any '0x' marker */
    if (inferred_radix == 16
        && rem != 0
        && p.getch() == '0'
        && (p.getch_at(1) == 'x' || p.getch_at(1) == 'X'))
    {
        /* skip the '0x' prefix */
        p.inc(&rem);
        p.inc(&rem);
    }

    /* allocate a temporary register for swapping with the accumulator */
    uint thdl;
    char *tmp = alloc_temp_reg(prec, &thdl);
    char *t1 = ext, *t2 = tmp;

    /* parse the digits */
    int significant = FALSE;
    for ( ; rem != 0 ; p.inc(&rem))
    {
        /* get the next character */
        wchar_t ch = p.getch();

        /* get the digit value of this character */
        int d;
        if (ch >= '0' && ch <= '9')
            d = ch - '0';
        else if (ch >= 'A' && ch <= 'Z')
            d = ch - 'A' + 10;
        else if (ch >= 'a' && ch <= 'z')
            d = ch - 'a' + 10;
        else
            break;

        /* if the digit isn't within the radix, it's not a digit after all */
        if (d >= radix)
            break;

        /* if it's not a leading zero, it's significant */
        if (ch != '0')
            significant = TRUE;

        /* if it's a significant digit, add it to the accumulator */
        if (significant)
        {
            /* 
             *   Set up a stack register with the digit value.  The radix can
             *   be up to 36, so the digit value can be up to 35, so we need
             *   up to two decimal digits to represent the digit value. 
             */
            char dreg[5 + 2] = { 2, 0, 0, 0, 0 };
            set_uint_val(dreg, d);

            /* shift the accumulator and add the digit */
            mul_by_long(t1, radix);
            compute_abs_sum_into(t2, t1, dreg);

            /* swap the accumulators */
            char *tt = t1;
            t1 = t2;
            t2 = tt;
        }
    }

    /* if we ended up with the value in 'tmp', copy it into our result */
    if (t1 != ext)
        copy_val(ext, t1, FALSE);

    /* free our temporary register */
    release_temp_reg(thdl);

    /* set the sign */
    set_neg(ext, neg);
}